

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

void __thiscall leveldb::VersionSet::Builder::Builder(Builder *this,VersionSet *vset,Version *base)

{
  long lVar1;
  undefined8 *puVar2;
  long lVar3;
  
  this->vset_ = vset;
  this->base_ = base;
  lVar3 = 0;
  do {
    lVar1 = (long)&this->levels_[0].deleted_files._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_color + lVar3;
    *(undefined4 *)
     ((long)&this->levels_[0].deleted_files._M_t._M_impl.super__Rb_tree_header._M_header._M_color +
     lVar3) = 0;
    *(undefined8 *)
     ((long)&this->levels_[0].deleted_files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent +
     lVar3) = 0;
    *(long *)((long)&this->levels_[0].deleted_files._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_left + lVar3) = lVar1;
    *(long *)((long)&this->levels_[0].deleted_files._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_right + lVar3) = lVar1;
    *(undefined8 *)
     ((long)&this->levels_[0].deleted_files._M_t._M_impl.super__Rb_tree_header._M_node_count + lVar3
     ) = 0;
    lVar3 = lVar3 + 0x38;
  } while (lVar3 != 0x188);
  base->refs_ = base->refs_ + 1;
  lVar3 = 0x40;
  do {
    puVar2 = (undefined8 *)operator_new(0x30);
    *puVar2 = &vset->icmp_;
    *(undefined4 *)(puVar2 + 1) = 0;
    puVar2[2] = 0;
    puVar2[3] = puVar2 + 1;
    puVar2[4] = puVar2 + 1;
    puVar2[5] = 0;
    *(undefined8 **)((long)this->levels_ + lVar3 + -0x10) = puVar2;
    lVar3 = lVar3 + 0x38;
  } while (lVar3 != 0x1c8);
  return;
}

Assistant:

Builder(VersionSet* vset, Version* base) : vset_(vset), base_(base) {
    base_->Ref();
    BySmallestKey cmp;
    cmp.internal_comparator = &vset_->icmp_;
    for (int level = 0; level < config::kNumLevels; level++) {
      levels_[level].added_files = new FileSet(cmp);
    }
  }